

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

Value * __thiscall
anon_unknown.dwarf_1c6f4d9::Target::DumpSource
          (Value *__return_storage_ptr__,Target *this,SourceAndKind *sk,ArrayIndex si)

{
  pointer *ppSVar1;
  __node_base *p_Var2;
  size_type *psVar3;
  pointer *ppCVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  uint uVar6;
  UInt value;
  pointer pSVar7;
  cmGeneratorTarget *headTarget;
  pointer pBVar8;
  _Base_ptr p_Var9;
  size_type sVar10;
  pointer pCVar11;
  pointer pCVar12;
  _Hash_node_base *p_Var13;
  __buckets_ptr pp_Var14;
  ValueHolder *pVVar15;
  ValueHolder VVar16;
  ValueHolder VVar17;
  ValueHolder VVar18;
  ValueHolder VVar19;
  undefined8 uVar20;
  CompileData *__k;
  pointer pbVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  bool bVar23;
  string *psVar24;
  Value *pVVar25;
  cmSourceGroup *pcVar26;
  _Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false> _Var27;
  ValueHolder VVar28;
  cmValue cVar29;
  iterator iVar30;
  ValueHolder VVar31;
  long *plVar32;
  ValueHolder VVar33;
  undefined8 uVar34;
  __hash_code _Var35;
  allocator_type *paVar36;
  ValueHolder VVar37;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var38;
  ValueHolder *pVVar39;
  Value *extraout_RAX;
  _Tp_alloc_type *__alloc;
  ulong uVar40;
  SourceGroup *__args;
  SourceGroup *extraout_RDX;
  SourceGroup *extraout_RDX_00;
  SourceGroup *extraout_RDX_01;
  SourceGroup *extraout_RDX_02;
  SourceGroup *pSVar41;
  char *pcVar42;
  _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var43;
  key_type *__key;
  size_type __n;
  pointer arch;
  _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  *this_00;
  SourceGroup *pSVar44;
  pointer pcVar45;
  Target *__n_00;
  _Hash_node_base _Var46;
  ulong uVar47;
  _Alloc_hider _Var48;
  ulong uVar49;
  pointer pBVar50;
  _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  long lVar51;
  ValueHolder *pVVar52;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar53;
  SourceGroup *pSVar54;
  pointer __ptr_1;
  bool *pbVar55;
  pair<std::__detail::_Node_iterator<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false,_false>,_bool>
  pVar56;
  undefined1 auVar57 [16];
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fileDefines;
  string path;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configFileDefines;
  string defPropName;
  string COMPILE_DEFINITIONS;
  string COMPILE_OPTIONS;
  string tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp_2;
  SourceGroup g;
  string COMPILE_FLAGS;
  ArrayIndex sgIndex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  cmGeneratorExpressionInterpreter genexInterpreter;
  undefined1 local_520 [32];
  ValueHolder local_500;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  _Hash_node_code_cache<true> local_4e0;
  undefined1 local_4d8 [32];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_4b8;
  undefined1 local_488 [32];
  ValueHolder local_468;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  cmSourceFile *local_458;
  ValueHolder local_450;
  string local_448;
  string local_428;
  undefined1 local_408 [32];
  ValueHolder local_3e8;
  size_t local_3e0;
  cmLocalGenerator *local_3d8;
  ArrayIndex local_3cc;
  undefined1 local_3c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  ValueHolder local_388;
  ValueHolder local_380;
  undefined1 local_378;
  undefined7 uStack_377;
  ValueHolder VStack_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_368;
  ValueHolder local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  ValueHolder local_348;
  ValueHolder VStack_340;
  CompileData *local_338;
  ValueHolder VStack_330;
  ValueHolder local_328;
  ValueHolder VStack_320;
  ValueHolder local_318;
  ValueHolder VStack_310;
  ValueHolder local_308;
  ValueHolder VStack_300;
  ValueHolder local_2f8;
  ValueHolder VStack_2f0;
  ValueHolder local_2e8;
  ValueHolder VStack_2e0;
  ValueHolder local_2d8;
  string local_2d0;
  undefined1 local_2b0 [17];
  undefined7 uStack_29f;
  undefined8 uStack_298;
  ValueHolder local_290;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  __node_base_ptr p_Stack_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  ulong local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  ValueHolder local_220;
  ValueHolder local_218;
  ValueHolder local_210 [2];
  ValueHolder *local_200;
  ValueHolder local_1f0 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  _Tp_alloc_type *local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  __node_base_ptr *local_198;
  size_type local_190;
  undefined1 local_188;
  undefined7 uStack_187;
  long lStack_180;
  string local_178;
  pointer local_158;
  pointer local_150;
  string local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  ulong local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_68;
  Value local_58;
  
  local_3cc = si;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  psVar24 = cmSourceFile::ResolveFullPath((sk->Source).Value,(string *)0x0,(string *)0x0);
  local_4d8._0_8_ = local_4d8 + 0x10;
  pcVar45 = (psVar24->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4d8,pcVar45,pcVar45 + psVar24->_M_string_length);
  cmSystemTools::RelativeIfUnder((string *)&local_220,&this->TopSource,(string *)local_4d8);
  Json::Value::Value((Value *)&local_3a8,(String *)&local_220);
  pVVar25 = Json::Value::operator[](__return_storage_ptr__,"path");
  Json::Value::operator=(pVVar25,(Value *)&local_3a8);
  Json::Value::~Value((Value *)&local_3a8);
  if (local_220 != local_210) {
    operator_delete(local_220.string_,local_210[0].int_ + 1);
  }
  bVar23 = cmSourceFile::GetIsGenerated((sk->Source).Value,GlobalAndLocal);
  if (bVar23) {
    Json::Value::Value((Value *)&local_3a8,true);
    pVVar25 = Json::Value::operator[](__return_storage_ptr__,"isGenerated");
    Json::Value::operator=(pVVar25,(Value *)&local_3a8);
    Json::Value::~Value((Value *)&local_3a8);
  }
  AddBacktrace(this,__return_storage_ptr__,&(sk->Source).Backtrace);
  pcVar26 = cmMakefile::FindSourceGroup
                      (this->GT->Makefile,(string *)local_4d8,&this->SourceGroupsLocal);
  if (pcVar26 != (cmSourceGroup *)0x0) {
    local_520._0_8_ = pcVar26;
    _Var27._M_cur =
         (__node_type *)
         std::
         _Hashtable<const_cmSourceGroup_*,_std::pair<const_cmSourceGroup_*const,_unsigned_int>,_std::allocator<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmSourceGroup_*>,_std::hash<const_cmSourceGroup_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->SourceGroupsMap)._M_h,(key_type *)local_520);
    if (_Var27._M_cur == (__node_type *)0x0) {
      local_2b0._0_4_ =
           (int)((ulong)((long)(this->SourceGroups).
                               super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->SourceGroups).
                              super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
      pVar56 = std::
               _Hashtable<cmSourceGroup_const*,std::pair<cmSourceGroup_const*const,unsigned_int>,std::allocator<std::pair<cmSourceGroup_const*const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<cmSourceGroup_const*>,std::hash<cmSourceGroup_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::_M_emplace<cmSourceGroup*&,unsigned_int&>
                         ((_Hashtable<cmSourceGroup_const*,std::pair<cmSourceGroup_const*const,unsigned_int>,std::allocator<std::pair<cmSourceGroup_const*const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<cmSourceGroup_const*>,std::hash<cmSourceGroup_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)&this->SourceGroupsMap,local_520);
      _Var27._M_cur =
           (__node_type *)
           pVar56.first.
           super__Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>.
           _M_cur;
      local_3a8._M_allocated_capacity = (size_type)&local_398;
      local_3a8._8_8_ = 0;
      local_398._M_local_buf[0] = '\0';
      Json::Value::Value((Value *)&local_388,arrayValue);
      cmSourceGroup::GetFullName_abi_cxx11_((cmSourceGroup *)local_520._0_8_);
      std::__cxx11::string::_M_assign((string *)local_3a8._M_local_buf);
      pSVar44 = (this->SourceGroups).
                super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar44 ==
          (this->SourceGroups).
          super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pSVar41 = (this->SourceGroups).
                  super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pSVar44 - (long)pSVar41 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        lVar51 = (long)pSVar44 - (long)pSVar41 >> 3;
        uVar40 = lVar51 * -0x71c71c71c71c71c7;
        uVar47 = 1;
        if (pSVar44 != pSVar41) {
          uVar47 = uVar40;
        }
        uVar49 = uVar47 + uVar40;
        if (0x1c71c71c71c71c6 < uVar49) {
          uVar49 = 0x1c71c71c71c71c7;
        }
        if (CARRY8(uVar47,uVar40)) {
          uVar49 = 0x1c71c71c71c71c7;
        }
        local_4e0._M_hash_code = (size_t)pSVar41;
        if (uVar49 == 0) {
          VVar28.int_ = 0;
        }
        else {
          VVar28.string_ = (char *)operator_new(uVar49 * 0x48);
          pSVar41 = extraout_RDX;
        }
        std::allocator_traits<std::allocator<(anonymous_namespace)::Target::SourceGroup>>::
        construct<(anonymous_namespace)::Target::SourceGroup,(anonymous_namespace)::Target::SourceGroup>
                  ((allocator_type *)&((ValueHolder *)(VVar28.int_ + lVar51 * 8))->bool_,
                   (SourceGroup *)&local_3a8,pSVar41);
        local_450 = VVar28;
        if (pSVar44 != (SourceGroup *)local_4e0._M_hash_code) {
          pSVar41 = extraout_RDX_00;
          paVar53 = &((string *)local_4e0._M_hash_code)->field_2;
          do {
            std::allocator_traits<std::allocator<(anonymous_namespace)::Target::SourceGroup>>::
            construct<(anonymous_namespace)::Target::SourceGroup,(anonymous_namespace)::Target::SourceGroup>
                      ((allocator_type *)VVar28.map_,(SourceGroup *)(paVar53->_M_local_buf + -0x10),
                       pSVar41);
            Json::Value::~Value((Value *)(paVar53->_M_local_buf + 0x10));
            pSVar41 = extraout_RDX_01;
            if (paVar53 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*(long **)(paVar53->_M_local_buf + -0x10)) {
              operator_delete(*(long **)(paVar53->_M_local_buf + -0x10),
                              paVar53->_M_allocated_capacity + 1);
              pSVar41 = extraout_RDX_02;
            }
            VVar28.string_ = (char *)(VVar28.int_ + 0x48);
            pSVar54 = (SourceGroup *)(paVar53->_M_local_buf + 0x38);
            paVar53 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar53->_M_local_buf + 0x48);
          } while (pSVar54 != pSVar44);
        }
        if ((SourceGroup *)local_4e0._M_hash_code != (SourceGroup *)0x0) {
          operator_delete((void *)local_4e0._M_hash_code,
                          (long)(this->SourceGroups).
                                super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          local_4e0._M_hash_code);
        }
        (this->SourceGroups).
        super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_450;
        (this->SourceGroups).
        super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(VVar28.int_ + 0x48);
        (this->SourceGroups).
        super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(local_450.int_ + uVar49 * 0x48);
      }
      else {
        std::allocator_traits<std::allocator<(anonymous_namespace)::Target::SourceGroup>>::
        construct<(anonymous_namespace)::Target::SourceGroup,(anonymous_namespace)::Target::SourceGroup>
                  ((allocator_type *)pSVar44,(SourceGroup *)&local_3a8,__args);
        ppSVar1 = &(this->SourceGroups).
                   super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      Json::Value::~Value((Value *)&local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_allocated_capacity != &local_398) {
        operator_delete((void *)local_3a8._M_allocated_capacity,
                        CONCAT71(local_398._M_allocated_capacity._1_7_,local_398._M_local_buf[0]) +
                        1);
      }
    }
    uVar6 = *(uint *)((long)&((_Var27._M_cur)->
                             super__Hash_node_value<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>
                             ._M_storage._M_storage + 8);
    pSVar7 = (this->SourceGroups).
             super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
             ._M_impl.super__Vector_impl_data._M_start;
    Json::Value::Value((Value *)&local_3a8,local_3cc);
    Json::Value::append(&pSVar7[uVar6].SourceIndexes,(Value *)&local_3a8);
    Json::Value::~Value((Value *)&local_3a8);
    Json::Value::Value((Value *)&local_220,
                       *(UInt *)((long)&((_Var27._M_cur)->
                                        super__Hash_node_value<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>
                                        ._M_storage._M_storage + 8));
    pVVar25 = Json::Value::operator[](__return_storage_ptr__,"sourceGroupIndex");
    Json::Value::operator=(pVVar25,(Value *)&local_220);
    Json::Value::~Value((Value *)&local_220);
  }
  if (sk->Kind != SourceKindObjectSource) goto LAB_00480e72;
  local_458 = (sk->Source).Value;
  local_3a8._M_allocated_capacity = (size_type)&local_398;
  local_3a8._8_8_ = 0;
  local_398._M_local_buf[0] = '\0';
  local_388.string_ = &local_378;
  local_380.int_ = 0;
  local_378 = 0;
  local_368 = &local_358;
  local_358._M_local_buf[0] = '\0';
  local_360.int_ = 0;
  local_2d8.int_ = 0;
  local_2e8.int_ = 0;
  VStack_2e0.int_ = 0;
  local_2f8.int_ = 0;
  VStack_2f0.int_ = 0;
  local_308.int_ = 0;
  VStack_300.int_ = 0;
  local_318.int_ = 0;
  VStack_310.int_ = 0;
  local_328.int_ = 0;
  VStack_320.int_ = 0;
  local_338 = (CompileData *)0x0;
  VStack_330.int_ = 0;
  local_348.int_ = 0;
  VStack_340.int_ = 0;
  VVar28.map_ = (ObjectValues *)cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(local_458);
  std::__cxx11::string::_M_assign((string *)local_3a8._M_local_buf);
  if (local_3a8._8_8_ != 0) {
    local_3d8 = cmGeneratorTarget::GetLocalGenerator(this->GT);
    pcVar45 = (this->Config->_M_dataplus)._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar45,pcVar45 + this->Config->_M_string_length);
    headTarget = this->GT;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_3a8._M_allocated_capacity,
               local_3a8._8_8_ + local_3a8._M_allocated_capacity);
    cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
              ((cmGeneratorExpressionInterpreter *)&local_220,local_3d8,&local_88,headTarget,
               &local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    local_2d0.field_2._M_allocated_capacity._0_5_ = 0x49504d4f43;
    local_2d0.field_2._M_allocated_capacity._5_3_ = 0x5f454c;
    local_2d0.field_2._8_5_ = 0x5347414c46;
    local_2d0._M_string_length = 0xd;
    local_2d0.field_2._M_local_buf[0xd] = '\0';
    cVar29 = cmSourceFile::GetProperty(local_458,&local_2d0);
    if (cVar29.Value != (string *)0x0) {
      pcVar45 = ((cVar29.Value)->_M_dataplus)._M_p;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar45,pcVar45 + (cVar29.Value)->_M_string_length);
      psVar24 = cmGeneratorExpressionInterpreter::Evaluate
                          ((cmGeneratorExpressionInterpreter *)&local_220,&local_c8,&local_2d0);
      pcVar26 = (cmSourceGroup *)(local_520 + 0x10);
      pcVar45 = (psVar24->_M_dataplus)._M_p;
      local_520._0_8_ = pcVar26;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_520,pcVar45,pcVar45 + psVar24->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        pcVar45 = (pointer)(local_c8.field_2._M_allocated_capacity + 1);
        operator_delete(local_c8._M_dataplus._M_p,(ulong)pcVar45);
      }
      VVar31 = local_328;
      VVar28 = VStack_330;
      uVar34 = local_520._8_8_;
      if (local_328.int_ == VStack_320.int_) {
        lVar51 = (long)local_328.string_ - (long)VStack_330;
        if (lVar51 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar40 = (lVar51 >> 3) * -0x3333333333333333;
        uVar47 = uVar40 + (uVar40 == 0);
        p_Var43 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(uVar47 + uVar40);
        if ((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x333333333333332 < p_Var43) {
          p_Var43 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x333333333333333;
        }
        if (CARRY8(uVar47,uVar40)) {
          p_Var43 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x333333333333333;
        }
        VVar37.map_ = (ObjectValues *)
                      std::
                      _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::_M_allocate(p_Var43,(size_t)pcVar45);
        uVar20 = local_520._16_8_;
        uVar34 = local_520._8_8_;
        plVar32 = (long *)(VVar37.string_ + lVar51);
        if ((cmSourceGroup *)local_520._0_8_ == pcVar26) {
          *plVar32 = (long)(plVar32 + 2);
          plVar32[2] = local_520._16_8_;
          *(undefined8 *)(plVar32 + 3) = local_520._24_8_;
        }
        else {
          *plVar32 = local_520._0_8_;
          plVar32[2] = local_520._16_8_;
          local_520._0_8_ = pcVar26;
        }
        local_520._16_8_ = local_520._16_8_ & 0xffffffffffffff00;
        local_520._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        plVar32[1] = uVar34;
        *(undefined4 *)(plVar32 + 4) = 0xffffffff;
        VVar31.int_ = (LargestInt)
                      std::
                      vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::_S_relocate(VVar28.int_,VVar31.int_,(pointer)VVar37.map_,
                                    (_Tp_alloc_type *)uVar20);
        if (VVar28.int_ != 0) {
          operator_delete(VVar28.string_,(long)VStack_320.string_ - (long)VVar28);
        }
        VStack_320.string_ = (char *)(VVar37.int_ + (long)p_Var43 * 0x28);
        VStack_330.map_ = VVar37.map_;
      }
      else {
        if ((cmSourceGroup *)local_520._0_8_ == pcVar26) {
          *(_Base_ptr **)&((local_328.map_)->_M_t)._M_impl.field_0x0 =
               (_Base_ptr *)
               ((long)&((local_328.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header + 8);
          *(undefined8 *)
           ((long)&((local_328.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header + 8) =
               local_520._16_8_;
          *(undefined8 *)
           ((long)&((local_328.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header + 0x10) =
               local_520._24_8_;
        }
        else {
          *(undefined8 *)&((local_328.map_)->_M_t)._M_impl.field_0x0 = local_520._0_8_;
          *(undefined8 *)
           ((long)&((local_328.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header + 8) =
               local_520._16_8_;
          local_520._0_8_ = pcVar26;
        }
        local_520._16_8_ = local_520._16_8_ & 0xffffffffffffff00;
        local_520._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        *(undefined8 *)&((local_328.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header = uVar34;
        *(undefined4 *)((long)&((local_328.map_)->_M_t)._M_impl.super__Rb_tree_header + 0x18) =
             0xffffffff;
      }
      local_328.string_ = (char *)(VVar31.int_ + 0x28);
      if ((cmSourceGroup *)local_520._0_8_ != pcVar26) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_520._16_8_ + 1));
      }
    }
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    local_428.field_2._M_allocated_capacity._0_7_ = 0x454c49504d4f43;
    local_428.field_2._M_local_buf[7] = '_';
    local_428.field_2._8_7_ = 0x534e4f4954504f;
    local_428._M_string_length = 0xf;
    local_428.field_2._M_local_buf[0xf] = '\0';
    pBVar50 = (local_458->CompileOptions).
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pBVar8 = (local_458->CompileOptions).
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar50 != pBVar8) {
      do {
        local_520._0_8_ = local_520 + 0x10;
        pcVar45 = (pBVar50->Value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar45,pcVar45 + (pBVar50->Value)._M_string_length);
        local_500 = (ValueHolder)
                    (pBVar50->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        p_Stack_4f8 = (pBVar50->Backtrace).
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        if (p_Stack_4f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Stack_4f8->_M_use_count = p_Stack_4f8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Stack_4f8->_M_use_count = p_Stack_4f8->_M_use_count + 1;
          }
        }
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,local_520._0_8_,(pointer)(local_520._0_8_ + local_520._8_8_)
                  );
        cmGeneratorExpressionInterpreter::Evaluate
                  ((cmGeneratorExpressionInterpreter *)&local_220,&local_178,&local_428);
        std::__cxx11::string::_M_assign((string *)local_520);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        local_408._0_8_ = local_408 + 0x10;
        local_408._8_8_ = 0;
        local_408._16_8_ = local_408._16_8_ & 0xffffffffffffff00;
        cmLocalGenerator::AppendCompileOptions
                  (local_3d8,(string *)local_408,(string *)local_520,(char *)0x0);
        local_198 = (__node_base_ptr *)&local_188;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,local_408._0_8_,(pointer)(local_408._0_8_ + local_408._8_8_)
                  );
        if (p_Stack_4f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Stack_4f8->_M_use_count = p_Stack_4f8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Stack_4f8->_M_use_count = p_Stack_4f8->_M_use_count + 1;
          }
        }
        if (local_198 == (__node_base_ptr *)&local_188) {
          uStack_298 = lStack_180;
          local_2b0._0_8_ = local_2b0 + 0x10;
        }
        else {
          local_2b0._0_8_ = local_198;
        }
        uStack_29f = uStack_187;
        local_2b0[0x10] = local_188;
        local_2b0._8_8_ = local_190;
        local_190 = 0;
        local_188 = 0;
        local_290 = local_500;
        local_288._M_pi = p_Stack_4f8;
        local_198 = (__node_base_ptr *)&local_188;
        (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_4b8,this,
                   (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_2b0);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&VStack_330.bool_,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_4b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8.Value._M_dataplus._M_p != &local_4b8.Value.field_2) {
          operator_delete(local_4b8.Value._M_dataplus._M_p,
                          (ulong)(local_4b8.Value.field_2._M_allocated_capacity + 1));
        }
        if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
        }
        if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
          operator_delete((void *)local_2b0._0_8_,stack0xfffffffffffffd60 + 1);
        }
        if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
          operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
        }
        if (p_Stack_4f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4f8);
        }
        if ((cmSourceGroup *)local_520._0_8_ != (cmSourceGroup *)(local_520 + 0x10)) {
          operator_delete((void *)local_520._0_8_,(ulong)(local_520._16_8_ + 1));
        }
        pBVar50 = pBVar50 + 1;
      } while (pBVar50 != pBVar8);
    }
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGeneratorTarget::GetAppleArchs(this->GT,this->Config,&local_278);
    if (local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&local_278);
    }
    pbVar21 = local_278.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_2b0._0_8_ = &p_Stack_280;
    local_2b0._8_8_ = 1;
    stack0xfffffffffffffd60 = 0;
    uStack_298 = 0;
    local_290.int_._0_4_ = 0x3f800000;
    local_288._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Stack_280 = (__node_base_ptr)0x0;
    if (local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      arch = local_278.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmGeneratorTarget::GetPchSource
                  (&local_4b8.Value,this->GT,this->Config,(string *)&local_3a8,arch);
        if (local_4b8.Value._M_string_length != 0) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_520,&local_4b8.Value,arch);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)local_2b0,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_520);
          if (local_500 != &local_4f0) {
            operator_delete(local_500.string_,local_4f0._M_allocated_capacity + 1);
          }
          if ((cmSourceGroup *)local_520._0_8_ != (cmSourceGroup *)(local_520 + 0x10)) {
            operator_delete((void *)local_520._0_8_,(ulong)(local_520._16_8_ + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8.Value._M_dataplus._M_p != &local_4b8.Value.field_2) {
          operator_delete(local_4b8.Value._M_dataplus._M_p,
                          (ulong)(local_4b8.Value.field_2._M_allocated_capacity + 1));
        }
        arch = arch + 1;
      } while (arch != pbVar21);
      paVar53 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_520 + 0x10);
      paVar5 = &local_4b8.Value.field_2;
      if (uStack_298 != 0) {
        local_4b8.Value._M_dataplus._M_p = (pointer)0x17;
        local_520._0_8_ = paVar53;
        local_520._0_8_ = std::__cxx11::string::_M_create((ulong *)local_520,(ulong)&local_4b8);
        local_520._16_8_ = local_4b8.Value._M_dataplus._M_p;
        *(undefined8 *)local_520._0_8_ = 0x4552505f50494b53;
        builtin_strncpy((char *)(local_520._0_8_ + 8),"COMPILE_",8);
        builtin_strncpy((char *)(local_520._0_8_ + 0xf),"_HEADERS",8);
        local_520._8_8_ = local_4b8.Value._M_dataplus._M_p;
        *(char *)(local_520._0_8_ + (long)local_4b8.Value._M_dataplus._M_p) = '\0';
        cVar29 = cmSourceFile::GetProperty(local_458,(string *)local_520);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._0_8_ != paVar53) {
          operator_delete((void *)local_520._0_8_,(ulong)(local_520._16_8_ + 1));
        }
        if (cVar29.Value == (string *)0x0) {
          local_488._8_8_ = (_Tp_alloc_type *)0x0;
          local_488._16_8_ = local_488._16_8_ & 0xffffffffffffff00;
          local_488._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_488 + 0x10);
          psVar24 = cmSourceFile::ResolveFullPath(local_458,(string *)0x0,(string *)0x0);
          iVar30 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_2b0,psVar24);
          if (iVar30.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            local_4b8.Value._M_string_length = 0;
            local_4b8.Value.field_2._M_allocated_capacity =
                 local_4b8.Value.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_4b8.Value._M_dataplus._M_p = (pointer)paVar5;
            cmGeneratorTarget::GetPchUseCompileOptions
                      ((string *)local_520,this->GT,this->Config,(string *)&local_3a8,
                       &local_4b8.Value);
            std::__cxx11::string::operator=((string *)local_488,(string *)local_520);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_520._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_520 + 0x10)) {
              operator_delete((void *)local_520._0_8_,(ulong)(local_520._16_8_ + 1));
            }
            uVar34 = local_4b8.Value.field_2._M_allocated_capacity;
            _Var48._M_p = local_4b8.Value._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b8.Value._M_dataplus._M_p != paVar5) goto LAB_0047f79f;
          }
          else {
            cmGeneratorTarget::GetPchCreateCompileOptions
                      ((string *)local_520,this->GT,this->Config,(string *)&local_3a8,
                       (string *)
                       ((long)iVar30.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              ._M_cur + 0x28));
            std::__cxx11::string::operator=((string *)local_488,(string *)local_520);
            uVar34 = local_520._16_8_;
            _Var48._M_p = (pointer)local_520._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_520._0_8_ != paVar53) {
LAB_0047f79f:
              operator_delete(_Var48._M_p,(ulong)(uVar34 + 1));
            }
          }
          local_240 = &local_230;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_240,local_488._0_8_,
                     (char *)(local_488._0_8_ + local_488._8_8_));
          local_68.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_68.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_68);
          paVar22 = local_238;
          if (local_240 == &local_230) {
            local_520._24_8_ = local_230._8_8_;
            local_240 = paVar53;
          }
          local_520._17_7_ = local_230._M_allocated_capacity._1_7_;
          local_520[0x10] = local_230._M_local_buf[0];
          local_520._8_8_ = local_238;
          local_238 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
          local_230._M_local_buf[0] = '\0';
          local_500.int_ =
               (LargestInt)
               local_68.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          p_Stack_4f8 = local_68.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_68.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_68.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pcVar42 = paVar22->_M_local_buf + (long)local_240;
          local_520._0_8_ = local_240;
          paVar22 = local_240;
          local_240 = &local_230;
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_e8,paVar22,pcVar42);
          cmGeneratorExpressionInterpreter::Evaluate
                    ((cmGeneratorExpressionInterpreter *)&local_220,&local_e8,&local_428);
          std::__cxx11::string::_M_assign((string *)local_520);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          local_448._M_string_length = 0;
          local_448.field_2._M_allocated_capacity =
               local_448.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
          cmLocalGenerator::AppendCompileOptions
                    (local_3d8,&local_448,(string *)local_520,(char *)0x0);
          local_128 = &local_118;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,local_448._M_dataplus._M_p,
                     local_448._M_dataplus._M_p +
                     (long)((RegularExpression *)(local_448._M_string_length + 0x40) + -1) + 0x90);
          if (p_Stack_4f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Stack_4f8->_M_use_count = p_Stack_4f8->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Stack_4f8->_M_use_count = p_Stack_4f8->_M_use_count + 1;
            }
          }
          if (local_128 == &local_118) {
            local_4b8.Value.field_2._8_8_ = local_118._8_8_;
            local_4b8.Value._M_dataplus._M_p = (pointer)paVar5;
          }
          else {
            local_4b8.Value._M_dataplus._M_p = (pointer)local_128;
          }
          local_4b8.Value.field_2._M_allocated_capacity._1_7_ =
               local_118._M_allocated_capacity._1_7_;
          local_4b8.Value.field_2._M_local_buf[0] = local_118._M_local_buf[0];
          local_4b8.Value._M_string_length = local_120;
          local_120 = 0;
          local_118._M_local_buf[0] = '\0';
          local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)local_500;
          local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Stack_4f8;
          local_128 = &local_118;
          (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                    ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_408,this,&local_4b8);
          std::
          vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
          ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                    ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                      *)&VStack_330.bool_,
                     (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_408);
          if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
            operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
          }
          if (local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_4b8.Backtrace.
                       super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8.Value._M_dataplus._M_p != paVar5) {
            operator_delete(local_4b8.Value._M_dataplus._M_p,
                            (ulong)(local_4b8.Value.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_448._M_dataplus._M_p != &local_448.field_2) {
            operator_delete(local_448._M_dataplus._M_p,
                            (ulong)(local_448.field_2._M_allocated_capacity + 1));
          }
          if (p_Stack_4f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4f8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._0_8_ != paVar53) {
            operator_delete((void *)local_520._0_8_,(ulong)(local_520._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_488 + 0x10)) {
            operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
          }
        }
      }
    }
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    local_520._0_8_ = (key_type)0x13;
    local_448._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_448,(ulong)local_520);
    local_448.field_2._M_allocated_capacity = local_520._0_8_;
    builtin_strncpy(local_448._M_dataplus._M_p,"INCLUDE_DIRECTORIES",0x13);
    local_448._M_string_length = local_520._0_8_;
    local_448._M_dataplus._M_p[local_520._0_8_] = '\0';
    pBVar50 = (local_458->IncludeDirectories).
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_158 = (local_458->IncludeDirectories).
                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar50 != local_158) {
      do {
        local_520._0_8_ = local_520 + 0x10;
        pcVar45 = (pBVar50->Value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar45,pcVar45 + (pBVar50->Value)._M_string_length);
        local_500 = (ValueHolder)
                    (pBVar50->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        p_Stack_4f8 = (pBVar50->Backtrace).
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        if (p_Stack_4f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Stack_4f8->_M_use_count = p_Stack_4f8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Stack_4f8->_M_use_count = p_Stack_4f8->_M_use_count + 1;
          }
        }
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_520._0_8_,(pointer)(local_520._0_8_ + local_520._8_8_)
                  );
        cmGeneratorExpressionInterpreter::Evaluate
                  ((cmGeneratorExpressionInterpreter *)&local_220,&local_148,&local_448);
        std::__cxx11::string::_M_assign((string *)local_520);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        local_3c8._0_8_ = (SourceGroup *)0x0;
        local_3c8._8_8_ = (SourceGroup *)0x0;
        local_3c8._16_8_ = (pointer)0x0;
        local_150 = pBVar50;
        cmLocalGenerator::AppendIncludeDirectories
                  (local_3d8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3c8,(string *)local_520,local_458);
        local_4e0._M_hash_code = local_3c8._8_8_;
        pSVar44 = (SourceGroup *)local_3c8._0_8_;
        if (local_3c8._0_8_ != local_3c8._8_8_) {
          do {
            bVar23 = cmGeneratorTarget::IsSystemIncludeDirectory
                               (this->GT,&pSVar44->Name,this->Config,(string *)&local_3a8);
            pcVar45 = (pSVar44->Name)._M_dataplus._M_p;
            local_260 = &local_250;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_260,pcVar45,pcVar45 + (pSVar44->Name)._M_string_length);
            if (p_Stack_4f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Stack_4f8->_M_use_count = p_Stack_4f8->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Stack_4f8->_M_use_count = p_Stack_4f8->_M_use_count + 1;
              }
            }
            if (local_260 == &local_250) {
              local_4b8.Value.field_2._8_8_ = local_250._8_8_;
              local_4b8.Value._M_dataplus._M_p = (pointer)&local_4b8.Value.field_2;
            }
            else {
              local_4b8.Value._M_dataplus._M_p = (pointer)local_260;
            }
            local_4b8.Value.field_2._M_allocated_capacity._1_7_ =
                 local_250._M_allocated_capacity._1_7_;
            local_4b8.Value.field_2._M_local_buf[0] = local_250._M_local_buf[0];
            local_4b8.Value._M_string_length = local_258;
            local_258 = 0;
            local_250._M_local_buf[0] = '\0';
            local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_500;
            local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Stack_4f8;
            __n_00 = this;
            local_260 = &local_250;
            (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                      ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_488,this,&local_4b8);
            VVar28 = VStack_2e0;
            uVar20 = local_488._16_8_;
            uVar34 = local_488._8_8_;
            if (VStack_2e0.int_ == local_2d8.int_) {
              local_450.int_ = local_2e8.int_;
              lVar51 = (long)VStack_2e0.string_ - (long)local_2e8;
              if (lVar51 == 0x7fffffffffffffe0) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar47 = (lVar51 >> 4) * -0x5555555555555555;
              uVar40 = uVar47 + (uVar47 == 0);
              this_00 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         *)(uVar40 + uVar47);
              if ((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   *)0x2aaaaaaaaaaaaa9 < this_00) {
                this_00 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                           *)0x2aaaaaaaaaaaaaa;
              }
              if (CARRY8(uVar40,uVar47)) {
                this_00 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                           *)0x2aaaaaaaaaaaaaa;
              }
              VVar37.map_ = (ObjectValues *)
                            std::
                            _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                            ::_M_allocate(this_00,(size_t)__n_00);
              VVar31 = local_450;
              uVar20 = local_488._16_8_;
              uVar34 = local_488._8_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._0_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_488 + 0x10)) {
                local_408._24_8_ = local_488._24_8_;
                local_488._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_408 + 0x10);
              }
              local_408._16_8_ = local_488._16_8_;
              pbVar55 = (bool *)(VVar37.string_ + lVar51);
              local_488._8_8_ = (_Tp_alloc_type *)0x0;
              local_488._16_8_ = local_488._16_8_ & 0xffffffffffffff00;
              *(bool **)pbVar55 = pbVar55 + 0x10;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._0_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_408 + 0x10)) {
                *(undefined8 *)(pbVar55 + 0x10) = uVar20;
                *(undefined8 *)(pbVar55 + 0x18) = local_408._24_8_;
              }
              else {
                *(undefined8 *)pbVar55 = local_488._0_8_;
                *(undefined8 *)(pbVar55 + 0x10) = uVar20;
              }
              *(undefined8 *)(pbVar55 + 8) = uVar34;
              *(undefined4 *)(pbVar55 + 0x20) = local_468._0_4_;
              pbVar55[0x28] = bVar23;
              local_488._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_488 + 0x10);
              VVar28.int_ = (LargestInt)
                            std::
                            vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                            ::_S_relocate(local_450.int_,VVar28.int_,(pointer)VVar37.map_,
                                          (_Tp_alloc_type *)uVar34);
              if (VVar31 != (ValueHolder *)0x0) {
                operator_delete(VVar31.string_,(long)local_2d8.string_ - (long)VVar31);
              }
              local_2d8.string_ = (char *)(VVar37.int_ + (long)this_00 * 0x30);
              local_2e8.map_ = VVar37.map_;
            }
            else {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._0_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_488 + 0x10)) {
                local_408._24_8_ = local_488._24_8_;
                local_488._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_408 + 0x10);
              }
              local_408._16_8_ = local_488._16_8_;
              local_488._8_8_ = (_Tp_alloc_type *)0x0;
              local_488._16_8_ = local_488._16_8_ & 0xffffffffffffff00;
              *(ValueHolder **)VStack_2e0.string_ = (ValueHolder *)(VStack_2e0.int_ + 0x10);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._0_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_408 + 0x10)) {
                ((ValueHolder *)(VStack_2e0.int_ + 0x10))->uint_ = uVar20;
                *(undefined8 *)(VStack_2e0.int_ + 0x18) = local_408._24_8_;
              }
              else {
                *(undefined8 *)VStack_2e0.string_ = local_488._0_8_;
                ((ValueHolder *)(VStack_2e0.int_ + 0x10))->uint_ = uVar20;
              }
              ((ValueHolder *)(VStack_2e0.int_ + 8))->map_ = (ObjectValues *)uVar34;
              *(undefined4 *)(VStack_2e0.int_ + 0x20) = local_468._0_4_;
              ((ValueHolder *)(VStack_2e0.int_ + 0x28))->bool_ = bVar23;
              local_488._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_488 + 0x10);
            }
            VStack_2e0.string_ = (char *)(VVar28.int_ + 0x30);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_488._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_488 + 0x10)) {
              operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
            }
            if (local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_4b8.Backtrace.
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b8.Value._M_dataplus._M_p != &local_4b8.Value.field_2) {
              operator_delete(local_4b8.Value._M_dataplus._M_p,
                              (ulong)(local_4b8.Value.field_2._M_allocated_capacity + 1));
            }
            pSVar44 = (SourceGroup *)&pSVar44->SourceIndexes;
          } while (pSVar44 != (SourceGroup *)local_4e0._M_hash_code);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3c8);
        if (p_Stack_4f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4f8);
        }
        pBVar50 = local_150;
        if ((key_type)local_520._0_8_ != (key_type)(local_520 + 0x10)) {
          operator_delete((void *)local_520._0_8_,(ulong)(local_520._16_8_ + 1));
        }
        pBVar50 = pBVar50 + 1;
      } while (pBVar50 != local_158);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,
                      (ulong)(local_448.field_2._M_allocated_capacity + 1));
    }
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    local_520._0_8_ = (cmSourceGroup *)0x13;
    local_448._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_448,(ulong)local_520);
    local_520._24_8_ = local_520 + 8;
    local_448.field_2._M_allocated_capacity = local_520._0_8_;
    builtin_strncpy(local_448._M_dataplus._M_p,"COMPILE_DEFINITIONS",0x13);
    local_448._M_string_length = local_520._0_8_;
    local_448._M_dataplus._M_p[local_520._0_8_] = '\0';
    local_520._8_8_ = local_520._8_8_ & 0xffffffff00000000;
    local_520._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    p_Stack_4f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pSVar44 = (SourceGroup *)
              (local_458->CompileDefinitions).
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_4e0._M_hash_code =
         (size_t)(local_458->CompileDefinitions).
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    local_500.string_ = (char *)local_520._24_8_;
    if (pSVar44 != (SourceGroup *)local_4e0._M_hash_code) {
      VVar28.string_ = local_408 + 8;
      do {
        local_4b8.Value._M_dataplus._M_p = (pointer)&local_4b8.Value.field_2;
        pcVar45 = (pSVar44->Name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4b8,pcVar45,pcVar45 + (pSVar44->Name)._M_string_length);
        local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = *(element_type **)&(pSVar44->SourceIndexes).value_;
        local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(pSVar44->SourceIndexes).bits_;
        if (local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
             .
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
             .
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_3c8._0_8_ = local_3c8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3c8,local_4b8.Value._M_dataplus._M_p,
                   local_4b8.Value._M_dataplus._M_p + local_4b8.Value._M_string_length);
        cmGeneratorExpressionInterpreter::Evaluate
                  ((cmGeneratorExpressionInterpreter *)&local_220,(string *)local_3c8,&local_448);
        std::__cxx11::string::_M_assign((string *)&local_4b8);
        if ((SourceGroup *)local_3c8._0_8_ != (SourceGroup *)(local_3c8 + 0x10)) {
          operator_delete((void *)local_3c8._0_8_,(ulong)(local_3c8._16_8_ + 1));
        }
        local_408._8_8_ = local_408._8_8_ & 0xffffffff00000000;
        local_408._16_8_ = 0;
        local_3e0 = 0;
        local_408._24_8_ = VVar28.string_;
        local_3e8.string_ = VVar28.string_;
        cmLocalGenerator::AppendDefines
                  (local_3d8,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_408,&local_4b8.Value);
        for (VVar31 = (ValueHolder)local_408._24_8_; VVar31.int_ != VVar28.int_;
            VVar31.int_ = std::_Rb_tree_increment(VVar31.int_)) {
          p_Var9 = ((VVar31.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
          local_1b8 = &local_1a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,p_Var9,
                     (long)&p_Var9->_M_color +
                     ((VVar31.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
          if (local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          if (local_1b8 == &local_1a8) {
            local_488._24_8_ = local_1a8._8_8_;
            local_488._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_488 + 0x10);
          }
          else {
            local_488._0_8_ = local_1b8;
          }
          local_488._17_7_ = local_1a8._M_allocated_capacity._1_7_;
          local_488[0x10] = local_1a8._M_local_buf[0];
          local_488._8_8_ = local_1b0;
          local_1b0 = (_Tp_alloc_type *)0x0;
          local_1a8._M_local_buf[0] = '\0';
          local_468 = (ValueHolder)
                      local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                      .TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
          local_460._M_pi =
               local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          local_1b8 = &local_1a8;
          std::
          _Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
          ::_M_insert_unique<BT<std::__cxx11::string>const&>
                    ((_Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
                      *)local_520,
                     (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_488);
          if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_488 + 0x10)) {
            operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_408);
        if (local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                     TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8.Value._M_dataplus._M_p != &local_4b8.Value.field_2) {
          operator_delete(local_4b8.Value._M_dataplus._M_p,
                          (ulong)(local_4b8.Value.field_2._M_allocated_capacity + 1));
        }
        pSVar44 = (SourceGroup *)&(pSVar44->SourceIndexes).comments_;
      } while (pSVar44 != (SourceGroup *)local_4e0._M_hash_code);
    }
    local_4b8.Value.field_2._8_8_ = &local_4b8.Value._M_string_length;
    local_4b8.Value._M_string_length = local_4b8.Value._M_string_length & 0xffffffff00000000;
    local_4b8.Value.field_2._M_allocated_capacity = 0;
    local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_4b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_4b8.Value.field_2._8_8_;
    cmsys::SystemTools::UpperCase((string *)local_408,this->Config);
    plVar32 = (long *)std::__cxx11::string::replace((ulong)local_408,0,(char *)0x0,0x75a037);
    local_488._0_8_ = local_488 + 0x10;
    paVar53 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar32 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar32 == paVar53) {
      local_488._16_8_ = paVar53->_M_allocated_capacity;
      local_488._24_8_ = *(ValueHolder *)(plVar32 + 3);
    }
    else {
      local_488._16_8_ = paVar53->_M_allocated_capacity;
      local_488._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar32;
    }
    local_488._8_8_ = plVar32[1];
    *plVar32 = (long)paVar53;
    plVar32[1] = 0;
    *(undefined1 *)(plVar32 + 2) = 0;
    if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
      operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
    }
    cVar29 = cmSourceFile::GetProperty(local_458,(string *)local_488);
    if (cVar29.Value != (string *)0x0) {
      pcVar45 = ((cVar29.Value)->_M_dataplus)._M_p;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar45,pcVar45 + (cVar29.Value)->_M_string_length);
      psVar24 = cmGeneratorExpressionInterpreter::Evaluate
                          ((cmGeneratorExpressionInterpreter *)&local_220,&local_108,&local_448);
      cmLocalGenerator::AppendDefines
                (local_3d8,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_4b8,psVar24);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
    VVar28.string_ =
         (char *)((long)&(local_4b8.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Stack_4f8);
    std::
    vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_318,VVar28.uint_);
    if ((undefined1 *)local_520._24_8_ != local_520 + 8) {
      VVar31 = (ValueHolder)local_520._24_8_;
      do {
        (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_408,this,
                   (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(VVar31.int_ + 0x20));
        VVar28.string_ = local_408;
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&local_318.bool_,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_408);
        if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
          VVar28.string_ = (char *)(local_408._16_8_ + 1);
          operator_delete((void *)local_408._0_8_,VVar28.uint_);
        }
        VVar31.int_ = std::_Rb_tree_increment(VVar31.int_);
      } while (VVar31 != local_520 + 8);
    }
    uVar34 = local_4b8.Value.field_2._8_8_;
    VVar37 = VVar28;
    VVar31 = VStack_310;
    if ((size_type *)local_4b8.Value.field_2._8_8_ != &local_4b8.Value._M_string_length) {
      do {
        VVar28 = VVar31;
        VVar31 = local_318;
        local_408._0_4_ = 0xffffffff;
        if (VVar28.int_ == local_308.int_) {
          lVar51 = (long)VVar28.string_ - (long)local_318;
          if (lVar51 == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar47 = (lVar51 >> 3) * -0x3333333333333333;
          uVar40 = uVar47 + (uVar47 == 0);
          p_Var43 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(uVar40 + uVar47);
          if ((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x333333333333332 < p_Var43) {
            p_Var43 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)0x333333333333333;
          }
          this_01 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x333333333333333;
          if (!CARRY8(uVar40,uVar47)) {
            this_01 = p_Var43;
          }
          VVar33.map_ = (ObjectValues *)
                        std::
                        _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::_M_allocate(this_01,VVar37.uint_);
          __alloc = (_Tp_alloc_type *)local_408;
          std::allocator_traits<std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>::
          construct<(anonymous_namespace)::JBT<std::__cxx11::string>,std::__cxx11::string_const&,(anonymous_namespace)::JBTIndex>
                    ((allocator_type *)(VVar33.string_ + lVar51),
                     *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       **)(uVar34 + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((_Rb_tree_node_base *)(uVar34 + 0x20))->_M_parent,(JBTIndex *)__alloc);
          VVar37.int_ = (LargestInt)
                        std::
                        vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::_S_relocate(VVar31.int_,VVar28.int_,(pointer)VVar33.map_,__alloc);
          if (VVar31.int_ != 0) {
            VVar28.string_ = local_308.string_ + -VVar31.int_;
            operator_delete(VVar31.string_,VVar28.uint_);
          }
          local_308.string_ = (char *)(VVar33.int_ + (long)this_01 * 0x28);
          local_318.map_ = VVar33.map_;
        }
        else {
          VVar31 = (ValueHolder)((ValueHolder *)(uVar34 + 0x20))->map_;
          std::allocator_traits<std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>::
          construct<(anonymous_namespace)::JBT<std::__cxx11::string>,std::__cxx11::string_const&,(anonymous_namespace)::JBTIndex>
                    ((allocator_type *)VVar28.map_,
                     (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)VVar31.map_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((_Rb_tree_node_base *)(uVar34 + 0x20))->_M_parent,(JBTIndex *)local_408);
          VVar28 = VVar31;
          VVar37 = VStack_310;
        }
        VVar31.string_ = (char *)((long)&((VVar37.map_)->_M_t)._M_impl.super__Rb_tree_header + 0x20)
        ;
        VStack_310 = VVar31;
        uVar34 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar34);
        VVar37 = VVar28;
      } while ((size_type *)uVar34 != &local_4b8.Value._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_488 + 0x10)) {
      VVar28.string_ = (char *)(local_488._16_8_ + 1);
      operator_delete((void *)local_488._0_8_,VVar28.uint_);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_4b8);
    std::
    _Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_520);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      VVar28.string_ = (char *)(local_448.field_2._M_allocated_capacity + 1);
      operator_delete(local_448._M_dataplus._M_p,VVar28.uint_);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_2b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      VVar28.string_ =
           (char *)(CONCAT17(local_428.field_2._M_local_buf[7],
                             local_428.field_2._M_allocated_capacity._0_7_) + 1);
      operator_delete(local_428._M_dataplus._M_p,VVar28.uint_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      VVar28.string_ =
           (char *)(CONCAT35(local_2d0.field_2._M_allocated_capacity._5_3_,
                             local_2d0.field_2._M_allocated_capacity._0_5_) + 1);
      operator_delete(local_2d0._M_dataplus._M_p,VVar28.uint_);
    }
    if (local_1d8 != &local_1c8) {
      VVar28.string_ = (char *)(local_1c8._M_allocated_capacity + 1);
      operator_delete(local_1d8,VVar28.uint_);
    }
    if (local_200 != local_210 + 4) {
      VVar28.int_ = local_1f0[0].int_ + 1;
      operator_delete(local_200,VVar28.uint_);
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_210);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_220);
  }
  _Var35 = std::__detail::
           _Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
           ::_M_hash_code((_Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                           *)local_3a8._M_local_buf,(CompileData *)VVar28.map_);
  sVar10 = (this->CompileGroupMap)._M_h._M_bucket_count;
  VVar28.map_ = (ObjectValues *)
                std::
                _Hashtable<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<(anonymous_namespace)::CompileData>,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::_M_find_node((_Hashtable<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<(anonymous_namespace)::CompileData>,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                *)(this->CompileGroupMap)._M_h._M_buckets,sVar10,
                               (key_type *)(_Var35 % sVar10),(__hash_code)&local_3a8);
  if ((ValueHolder *)VVar28.int_ == (ValueHolder *)0x0) {
    pCVar11 = (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pCVar12 = (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_start;
    VVar28.string_ = (char *)operator_new(0xf0);
    __k = local_338;
    ((ValueHolder *)&(VVar28.map_)->_M_t)->int_ = 0;
    VVar31.string_ = (char *)(VVar28.int_ + 8);
    pVVar15 = (ValueHolder *)(VVar28.int_ + 0x18);
    ((ValueHolder *)(VVar28.int_ + 8))->string_ = (char *)pVVar15;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_allocated_capacity == &local_398) {
      VVar37.int_._1_7_ = local_398._M_allocated_capacity._1_7_;
      VVar37.bool_ = (bool)local_398._M_local_buf[0];
      *pVVar15 = VVar37;
      *(undefined8 *)(VVar28.int_ + 0x20) = local_398._8_8_;
    }
    else {
      *(size_type *)VVar31.string_ = local_3a8._M_allocated_capacity;
      VVar33.int_._1_7_ = local_398._M_allocated_capacity._1_7_;
      VVar33.bool_ = (bool)local_398._M_local_buf[0];
      *pVVar15 = VVar33;
    }
    ((ValueHolder *)(VVar28.int_ + 0x10))->int_ = local_3a8._8_8_;
    local_3a8._8_8_ = 0;
    local_398._M_local_buf[0] = '\0';
    ((ValueHolder *)(VVar28.int_ + 0x28))->string_ = (char *)(VVar28.int_ + 0x38);
    if (local_388 == &local_378) {
      VVar17.int_._1_7_ = uStack_377;
      VVar17.bool_ = (bool)local_378;
      *(ValueHolder *)(VVar28.int_ + 0x38) = VVar17;
      *(ValueHolder *)(VVar28.int_ + 0x40) = VStack_370;
    }
    else {
      ((ValueHolder *)(VVar28.int_ + 0x28))->int_ = (LargestInt)local_388;
      VVar16.int_._1_7_ = uStack_377;
      VVar16.bool_ = (bool)local_378;
      *(ValueHolder *)(VVar28.int_ + 0x38) = VVar16;
    }
    *(ValueHolder *)(VVar28.int_ + 0x30) = local_380;
    local_380.int_ = 0;
    local_378 = 0;
    ((ValueHolder *)(VVar28.int_ + 0x48))->string_ = (char *)(VVar28.int_ + 0x58);
    if (local_368 == &local_358) {
      VVar19.int_._1_7_ = local_358._M_allocated_capacity._1_7_;
      VVar19.bool_ = (bool)local_358._M_local_buf[0];
      *(ValueHolder *)(VVar28.int_ + 0x58) = VVar19;
      *(undefined8 *)(VVar28.int_ + 0x60) = local_358._8_8_;
    }
    else {
      ((ValueHolder *)(VVar28.int_ + 0x48))->int_ = (LargestInt)local_368;
      VVar18.int_._1_7_ = local_358._M_allocated_capacity._1_7_;
      VVar18.bool_ = (bool)local_358._M_local_buf[0];
      *(ValueHolder *)(VVar28.int_ + 0x58) = VVar18;
    }
    *(ValueHolder *)(VVar28.int_ + 0x50) = local_360;
    local_360.int_ = 0;
    local_358._M_local_buf[0] = '\0';
    *(ValueHolder *)(VVar28.int_ + 0x68) = local_348;
    *(ValueHolder *)(VVar28.int_ + 0x70) = VStack_340;
    ((ValueHolder *)(VVar28.int_ + 0x78))->map_ = (ObjectValues *)local_338;
    local_338 = (CompileData *)0x0;
    local_348.int_ = 0;
    VStack_340.int_ = 0;
    *(ValueHolder *)(VVar28.int_ + 0x80) = VStack_330;
    *(ValueHolder *)(VVar28.int_ + 0x88) = local_328;
    *(ValueHolder *)(VVar28.int_ + 0x90) = VStack_320;
    VStack_320.int_ = 0;
    VStack_330.int_ = 0;
    local_328.int_ = 0;
    *(ValueHolder *)(VVar28.int_ + 0x98) = local_318;
    *(ValueHolder *)(VVar28.int_ + 0xa0) = VStack_310;
    *(ValueHolder *)(VVar28.int_ + 0xa8) = local_308;
    local_308.int_ = 0;
    local_318.int_ = 0;
    VStack_310.int_ = 0;
    *(ValueHolder *)(VVar28.int_ + 0xb0) = VStack_300;
    *(ValueHolder *)(VVar28.int_ + 0xb8) = local_2f8;
    *(ValueHolder *)(VVar28.int_ + 0xc0) = VStack_2f0;
    VStack_2f0.int_ = 0;
    VStack_300.int_ = 0;
    local_2f8.int_ = 0;
    *(ValueHolder *)(VVar28.int_ + 200) = local_2e8;
    *(ValueHolder *)(VVar28.int_ + 0xd0) = VStack_2e0;
    *(ValueHolder *)(VVar28.int_ + 0xd8) = local_2d8;
    local_2d8.int_ = 0;
    local_2e8.int_ = 0;
    VStack_2e0.int_ = 0;
    *(int *)(VVar28.int_ + 0xe0) = (int)((ulong)((long)pCVar11 - (long)pCVar12) >> 4) * -0x55555555;
    local_3a8._M_allocated_capacity = (size_type)&local_398;
    local_388.string_ = &local_378;
    local_368 = &local_358;
    paVar36 = (allocator_type *)
              std::__detail::
              _Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
              ::_M_hash_code((_Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                              *)VVar31.map_,__k);
    sVar10 = (this->CompileGroupMap)._M_h._M_bucket_count;
    __key = (key_type *)((ulong)paVar36 % sVar10);
    VVar37.map_ = (ObjectValues *)
                  std::
                  _Hashtable<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<(anonymous_namespace)::CompileData>,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::_M_find_node((_Hashtable<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<(anonymous_namespace)::CompileData>,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                  *)(this->CompileGroupMap)._M_h._M_buckets,sVar10,__key,
                                 VVar31.uint_);
    if ((ValueHolder *)VVar37.int_ == (ValueHolder *)0x0) {
      local_4e0._M_hash_code = (size_t)paVar36;
      local_450.string_ = VVar31.string_;
      auVar57 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                          ((ulong)&(this->CompileGroupMap)._M_h._M_rehash_policy,sVar10,
                           (this->CompileGroupMap)._M_h._M_element_count);
      __n = auVar57._8_8_;
      if ((auVar57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __s = (this->CompileGroupMap)._M_h._M_buckets;
      }
      else {
        if (__n == 1) {
          __s = &(this->CompileGroupMap)._M_h._M_single_bucket;
          (this->CompileGroupMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        }
        else {
          __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                          ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_220.bool_,__n,
                           (void *)0x0);
          memset(__s,0,__n * 8);
        }
        _Var46._M_nxt = (this->CompileGroupMap)._M_h._M_before_begin._M_nxt;
        (this->CompileGroupMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        if (_Var46._M_nxt != (_Hash_node_base *)0x0) {
          p_Var2 = &(this->CompileGroupMap)._M_h._M_before_begin;
          uVar47 = 0;
          do {
            p_Var13 = (_Var46._M_nxt)->_M_nxt;
            uVar40 = (ulong)_Var46._M_nxt[0x1d]._M_nxt % __n;
            if (__s[uVar40] == (_Hash_node_base *)0x0) {
              (_Var46._M_nxt)->_M_nxt = p_Var2->_M_nxt;
              p_Var2->_M_nxt = _Var46._M_nxt;
              __s[uVar40] = p_Var2;
              if ((_Var46._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                pp_Var38 = __s + uVar47;
                goto LAB_00480b71;
              }
            }
            else {
              (_Var46._M_nxt)->_M_nxt = __s[uVar40]->_M_nxt;
              pp_Var38 = &__s[uVar40]->_M_nxt;
              uVar40 = uVar47;
LAB_00480b71:
              *pp_Var38 = _Var46._M_nxt;
            }
            _Var46._M_nxt = p_Var13;
            uVar47 = uVar40;
          } while (p_Var13 != (_Hash_node_base *)0x0);
        }
        pp_Var14 = (this->CompileGroupMap)._M_h._M_buckets;
        if (&(this->CompileGroupMap)._M_h._M_single_bucket != pp_Var14) {
          operator_delete(pp_Var14,(this->CompileGroupMap)._M_h._M_bucket_count << 3);
        }
        (this->CompileGroupMap)._M_h._M_bucket_count = __n;
        (this->CompileGroupMap)._M_h._M_buckets = __s;
        __key = (key_type *)(local_4e0._M_hash_code % __n);
      }
      ((ValueHolder *)(VVar28.int_ + 0xe8))->uint_ = local_4e0._M_hash_code;
      if (__s[(long)__key] == (_Hash_node_base *)0x0) {
        _Var46._M_nxt = (this->CompileGroupMap)._M_h._M_before_begin._M_nxt;
        ((ValueHolder *)&(VVar28.map_)->_M_t)->int_ = (LargestInt)_Var46._M_nxt;
        (this->CompileGroupMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)VVar28;
        if (_Var46._M_nxt != (_Hash_node_base *)0x0) {
          ((ValueHolder *)
          (__s + (ulong)_Var46._M_nxt[0x1d]._M_nxt % (this->CompileGroupMap)._M_h._M_bucket_count))
          ->int_ = (LargestInt)VVar28;
          __s = (this->CompileGroupMap)._M_h._M_buckets;
        }
        __s[(long)__key] = &(this->CompileGroupMap)._M_h._M_before_begin;
      }
      else {
        *(_Hash_node_base **)&(VVar28.map_)->_M_t = __s[(long)__key]->_M_nxt;
        __s[(long)__key]->_M_nxt = (_Hash_node_base *)VVar28;
      }
      psVar3 = &(this->CompileGroupMap)._M_h._M_element_count;
      *psVar3 = *psVar3 + 1;
    }
    else {
      CompileData::~CompileData((CompileData *)VVar31.map_);
      operator_delete(VVar28.string_,0xf0);
      VVar28.map_ = VVar37.map_;
    }
    local_220.int_ = 0;
    Json::Value::Value((Value *)&local_218,arrayValue);
    pVVar15 = (ValueHolder *)
              (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_220 = VVar28;
    if (pVVar15 ==
        (ValueHolder *)
        (this->CompileGroups).
        super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      VVar31 = (ValueHolder)
               (this->CompileGroups).
               super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar51 = (long)pVVar15 - (long)VVar31;
      if (lVar51 == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar40 = (lVar51 >> 4) * -0x5555555555555555;
      uVar47 = 1;
      if (pVVar15 != (ValueHolder *)VVar31.int_) {
        uVar47 = uVar40;
      }
      local_4e0._M_hash_code = uVar47 + uVar40;
      if ((SourceGroup *)0x2aaaaaaaaaaaaa9 < local_4e0._M_hash_code) {
        local_4e0._M_hash_code = 0x2aaaaaaaaaaaaaa;
      }
      if (CARRY8(uVar47,uVar40)) {
        local_4e0._M_hash_code = 0x2aaaaaaaaaaaaaa;
      }
      pVVar39 = (ValueHolder *)operator_new(local_4e0._M_hash_code * 0x30);
      ((ValueHolder *)((long)pVVar39 + lVar51))->map_ = (ObjectValues *)local_220;
      Json::Value::Value((Value *)((long)pVVar39 + lVar51 + 8),(Value *)&local_218);
      VVar33 = VVar31;
      pVVar52 = pVVar39;
      VVar37 = local_450;
      for (; local_450 = VVar33, pVVar15 != VVar31; VVar31.string_ = (char *)(VVar31.int_ + 0x30)) {
        *pVVar52 = (ValueHolder)*VVar31.int_;
        Json::Value::Value((Value *)(pVVar52 + 1),(Value *)(VVar31.int_ + 8));
        Json::Value::~Value((Value *)(VVar31.int_ + 8));
        pVVar52 = pVVar52 + 6;
        VVar33 = local_450;
        VVar37 = local_450;
      }
      if (local_450 != (ValueHolder *)0x0) {
        uVar47 = (long)(this->CompileGroups).
                       super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)local_450;
        VVar31 = local_450;
        local_450 = VVar37;
        operator_delete(VVar31.string_,uVar47);
        VVar37 = local_450;
      }
      local_450 = VVar37;
      (this->CompileGroups).
      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pVVar39;
      (this->CompileGroups).
      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pVVar52 + 6);
      (this->CompileGroups).
      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(pVVar39 + local_4e0._M_hash_code * 6);
    }
    else {
      pVVar15->map_ = (ObjectValues *)VVar28;
      Json::Value::Value((Value *)(pVVar15 + 1),(Value *)&local_218);
      ppCVar4 = &(this->CompileGroups).
                 super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar4 = *ppCVar4 + 1;
    }
    Json::Value::~Value((Value *)&local_218);
  }
  uVar6 = *(uint *)((ValueHolder *)(VVar28.map_ + 4) + 4);
  pCVar11 = (this->CompileGroups).
            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
            ._M_impl.super__Vector_impl_data._M_start;
  Json::Value::Value((Value *)&local_220,local_3cc);
  Json::Value::append(&pCVar11[uVar6].SourceIndexes,(Value *)&local_220);
  Json::Value::~Value((Value *)&local_220);
  value = *(UInt *)((ValueHolder *)(VVar28.map_ + 4) + 4);
  CompileData::~CompileData((CompileData *)&local_3a8);
  Json::Value::Value(&local_58,value);
  pVVar25 = Json::Value::operator[](__return_storage_ptr__,"compileGroupIndex");
  Json::Value::operator=(pVVar25,&local_58);
  Json::Value::~Value(&local_58);
LAB_00480e72:
  pVVar25 = (Value *)(local_4d8 + 0x10);
  if ((Value *)local_4d8._0_8_ != pVVar25) {
    operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
    pVVar25 = extraout_RAX;
  }
  return pVVar25;
}

Assistant:

Json::Value Target::DumpSource(cmGeneratorTarget::SourceAndKind const& sk,
                               Json::ArrayIndex si)
{
  Json::Value source = Json::objectValue;

  std::string const path = sk.Source.Value->ResolveFullPath();
  source["path"] = RelativeIfUnder(this->TopSource, path);
  if (sk.Source.Value->GetIsGenerated()) {
    source["isGenerated"] = true;
  }
  this->AddBacktrace(source, sk.Source.Backtrace);

  if (cmSourceGroup* sg =
        this->GT->Makefile->FindSourceGroup(path, this->SourceGroupsLocal)) {
    source["sourceGroupIndex"] = this->AddSourceGroup(sg, si);
  }

  switch (sk.Kind) {
    case cmGeneratorTarget::SourceKindObjectSource: {
      source["compileGroupIndex"] =
        this->AddSourceCompileGroup(sk.Source.Value, si);
    } break;
    case cmGeneratorTarget::SourceKindAppManifest:
    case cmGeneratorTarget::SourceKindCertificate:
    case cmGeneratorTarget::SourceKindCustomCommand:
    case cmGeneratorTarget::SourceKindExternalObject:
    case cmGeneratorTarget::SourceKindExtra:
    case cmGeneratorTarget::SourceKindHeader:
    case cmGeneratorTarget::SourceKindIDL:
    case cmGeneratorTarget::SourceKindManifest:
    case cmGeneratorTarget::SourceKindModuleDefinition:
    case cmGeneratorTarget::SourceKindResx:
    case cmGeneratorTarget::SourceKindXaml:
    case cmGeneratorTarget::SourceKindUnityBatched:
      break;
  }

  return source;
}